

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateFor(ExpressionEvalContext *ctx,ExprFor *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ExprIntegerLiteral *expr;
  ExprBase *pEVar9;
  _func_int **pp_Var10;
  undefined4 extraout_var;
  char *msg;
  
  uVar7 = ctx->instructionsLimit;
  if (ctx->instruction < uVar7) {
    uVar6 = ctx->instruction + 1;
    ctx->instruction = uVar6;
    uVar1 = (ctx->stackFrames).count;
    if (uVar1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
    if (pSVar2->targetYield == 0) {
      pEVar9 = Evaluate(ctx,expression->initializer);
      if (pEVar9 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      uVar6 = ctx->instruction;
      uVar7 = ctx->instructionsLimit;
    }
    if (uVar6 < uVar7) {
      do {
        ctx->instruction = uVar6 + 1;
        if (pSVar2->targetYield == 0) {
          if (expression->condition == (ExprBase *)0x0) {
            return (ExprBase *)0x0;
          }
          pEVar9 = Evaluate(ctx,expression->condition);
          if (pEVar9 == (ExprBase *)0x0) {
            return (ExprBase *)0x0;
          }
          switch(pEVar9->typeID) {
          case 3:
            pp_Var10 = (_func_int **)(ulong)(byte)pEVar9->field_0x29;
            break;
          case 4:
            pp_Var10 = (_func_int **)(long)(char)pEVar9->field_0x29;
            break;
          default:
            msg = "ERROR: failed to evaluate \'for\' condition";
            goto LAB_0013d663;
          case 6:
            pp_Var10 = pEVar9[1]._vptr_ExprBase;
            break;
          case 7:
            pp_Var10 = (_func_int **)(long)(double)pEVar9[1]._vptr_ExprBase;
          }
          if (pp_Var10 == (_func_int **)0x0) goto LAB_0013d684;
        }
        pEVar9 = Evaluate(ctx,expression->body);
        if (pEVar9 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (pSVar2->breakDepth != 0) {
          pSVar2->breakDepth = pSVar2->breakDepth - 1;
LAB_0013d684:
          pAVar3 = ctx->ctx->allocator;
          iVar8 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar8);
          pSVar4 = (expression->super_ExprBase).source;
          pTVar5 = ctx->ctx->typeVoid;
          pEVar9->typeID = 2;
          pEVar9->source = pSVar4;
          pEVar9->type = pTVar5;
          pEVar9->next = (ExprBase *)0x0;
          pEVar9->listed = false;
          pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
          pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
          return pEVar9;
        }
        if (((pSVar2->continueDepth != 0) &&
            (uVar7 = pSVar2->continueDepth - 1, pSVar2->continueDepth = uVar7, uVar7 != 0)) ||
           (pSVar2->returnValue != (ExprBase *)0x0)) goto LAB_0013d684;
        if ((pSVar2->targetYield == 0) &&
           (pEVar9 = Evaluate(ctx,expression->increment), pEVar9 == (ExprBase *)0x0)) {
          return (ExprBase *)0x0;
        }
        uVar6 = ctx->instruction;
      } while (uVar6 < ctx->instructionsLimit);
    }
  }
  msg = "ERROR: instruction limit reached";
LAB_0013d663:
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateFor(ExpressionEvalContext &ctx, ExprFor *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(!frame->targetYield)
	{
		if(!Evaluate(ctx, expression->initializer))
			return NULL;
	}

	for(;;)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!frame->targetYield)
		{
			if(!expression->condition)
				return NULL;

			ExprBase *condition = Evaluate(ctx, expression->condition);

			if(!condition)
				return NULL;

			long long result;
			if(!TryTakeLong(condition, result))
				return Report(ctx, "ERROR: failed to evaluate 'for' condition");

			if(!result)
				break;
		}

		if(!Evaluate(ctx, expression->body))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;
			break;
		}

		// On continue, decrease depth and proceed to next iteration, unless it's a multi-level continue
		if(frame->continueDepth)
		{
			frame->continueDepth--;

			if(frame->continueDepth)
				break;
		}

		if(frame->returnValue)
			break;

		if(!frame->targetYield)
		{
			if(!Evaluate(ctx, expression->increment))
				return NULL;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}